

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

void __thiscall CLI::App::_process_config_file(App *this)

{
  bool bVar1;
  Option *pOVar2;
  pointer pbVar3;
  pointer pbVar4;
  char cVar5;
  FileError *pFVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> config_file;
  error_code ec;
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> values;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  error_code local_b0;
  string local_a0;
  string local_80;
  path local_60;
  pointer local_38;
  
  pOVar2 = this->config_ptr_;
  if (pOVar2 != (Option *)0x0) {
    bVar1 = (pOVar2->super_OptionBase<CLI::Option>).required_;
    pbVar3 = (pOVar2->results_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar4 = (pOVar2->results_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    Option::as<std::__cxx11::string>(&local_f0,pOVar2);
    if (local_f0._M_string_length == 0) {
      if (bVar1 != false) {
        pFVar6 = (FileError *)__cxa_allocate_exception(0x38);
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_80,"no specified config file","");
        FileError::Missing(pFVar6,&local_80);
        __cxa_throw(pFVar6,&FileError::typeinfo,Error::~Error);
      }
    }
    else {
      local_38 = local_f0._M_dataplus._M_p;
      local_b0._M_value = 0;
      local_b0._M_cat = (error_category *)::std::_V2::system_category();
      ::std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
                (&local_60,&local_38,auto_format);
      cVar5 = ::std::filesystem::status(&local_60,&local_b0);
      std::filesystem::__cxx11::path::~path(&local_60);
      if ((((local_b0._M_value == 0) && (cVar5 != '\0')) && (cVar5 != '\x02')) && (cVar5 != -1)) {
        Config::from_file((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)&local_60,
                          (this->config_formatter_).
                          super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          &local_f0);
        _parse_config(this,(vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)&local_60);
        if (pbVar3 == pbVar4) {
          pOVar2 = this->config_ptr_;
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d0,local_f0._M_dataplus._M_p,
                     local_f0._M_dataplus._M_p + local_f0._M_string_length);
          Option::_add_result(pOVar2,&local_d0,&pOVar2->results_);
          pOVar2->current_option_state_ = parsing;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
        }
        std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::~vector
                  ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)&local_60);
      }
      else if ((pbVar3 != pbVar4) || (bVar1 != false)) {
        pFVar6 = (FileError *)__cxa_allocate_exception(0x38);
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a0,local_f0._M_dataplus._M_p,
                   local_f0._M_dataplus._M_p + local_f0._M_string_length);
        FileError::Missing(pFVar6,&local_a0);
        __cxa_throw(pFVar6,&FileError::typeinfo,Error::~Error);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void _process_config_file() {
        if(config_ptr_ != nullptr) {
            bool config_required = config_ptr_->get_required();
            bool file_given = config_ptr_->count() > 0;
            auto config_file = config_ptr_->as<std::string>();
            if(config_file.empty()) {
                if(config_required) {
                    throw FileError::Missing("no specified config file");
                }
                return;
            }

            auto path_result = detail::check_path(config_file.c_str());
            if(path_result == detail::path_type::file) {
                try {
                    std::vector<ConfigItem> values = config_formatter_->from_file(config_file);
                    _parse_config(values);
                    if(!file_given) {
                        config_ptr_->add_result(config_file);
                    }
                } catch(const FileError &) {
                    if(config_required || file_given)
                        throw;
                }
            } else if(config_required || file_given) {
                throw FileError::Missing(config_file);
            }
        }
    }